

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

bool __thiscall pbrt::Image::WriteEXR(Image *this,string *name,ImageMetadata *metadata)

{
  undefined8 *puVar1;
  Tuple2<pbrt::Point2,_int> TVar2;
  aligned_storage_t<sizeof(pbrt::Point2<int>),_alignof(pbrt::Point2<int>)> aVar3;
  undefined8 uVar4;
  Point2i *pPVar5;
  int *piVar6;
  undefined1 auVar7 [64];
  string *psVar8;
  bool bVar9;
  int iVar10;
  _Rb_tree_node_base *p_Var11;
  _Rb_tree_node_base *p_Var12;
  char *pcVar13;
  _Base_ptr p_Var14;
  aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
  aVar15;
  uint uVar16;
  long lVar17;
  _Rb_tree_header *p_Var18;
  undefined1 auVar20 [16];
  undefined1 auVar21 [64];
  undefined1 auVar22 [16];
  OutputFile file;
  Header header;
  FrameBuffer fb;
  float m [4] [4];
  Box2i local_208;
  string *local_1f8;
  undefined1 local_1f0 [16];
  anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
  aStack_1e0;
  V2f VStack_1d0;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> local_1b8;
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> local_198;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_178;
  undefined8 local_158;
  undefined8 uStack_150;
  Image *local_140;
  string local_138 [56];
  Tuple2<pbrt::Point2,_float> local_100;
  Tuple2<pbrt::Point2,_float> local_f8;
  _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
  local_f0;
  ColorEncodingHandle local_c0;
  Chromaticities local_b8;
  undefined1 auStack_98 [32];
  Matrix44<float> local_78;
  undefined1 auVar19 [16];
  
  if (this->format - Half < 2) {
    local_158 = 0;
    TVar2 = (this->resolution).super_Tuple2<pbrt::Point2,_int>;
    aVar3 = (metadata->fullResolution).optionalValue;
    uVar16 = 0xff;
    if ((metadata->fullResolution).set == false) {
      uVar16 = 0;
    }
    auVar22._8_8_ = 0;
    auVar22._0_8_ = aVar3;
    auVar19 = vmovdqa32_avx512vl(auVar22);
    bVar9 = (bool)((byte)uVar16 & 1);
    auVar20._0_4_ = (uint)bVar9 * auVar19._0_4_ | (uint)!bVar9 * TVar2.x;
    bVar9 = (bool)((byte)(uVar16 >> 1) & 1);
    auVar20._4_4_ = (uint)bVar9 * auVar19._4_4_ | (uint)!bVar9 * TVar2.y;
    auVar20._8_4_ = (uint)((byte)(uVar16 >> 2) & 1) * auVar19._8_4_;
    auVar20._12_4_ = (uint)((byte)(uVar16 >> 3) & 1) * auVar19._12_4_;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = aVar3;
    auVar19 = vpcmpeqd_avx(auVar22,auVar19);
    auVar19 = vpaddd_avx(auVar20,auVar19);
    uStack_150 = auVar19._0_8_;
    pPVar5 = (Point2i *)((long)&(metadata->pixelBounds).optionalValue + 8);
    piVar6 = (int *)((long)&(metadata->pixelBounds).optionalValue + 0xc);
    if ((metadata->pixelBounds).set == false) {
      local_208.min.x = 0;
      local_208.min.y = 0;
      pPVar5 = &this->resolution;
      piVar6 = &(this->resolution).super_Tuple2<pbrt::Point2,_int>.y;
    }
    else {
      local_208.min = *(Vec2<int> *)&(metadata->pixelBounds).optionalValue;
    }
    local_208.max.y = *piVar6 + -1;
    local_208.max.x = (pPVar5->super_Tuple2<pbrt::Point2,_int>).x + -1;
    local_1f8 = name;
    AllChannelsDesc((ImageChannelDesc *)local_1f0,this);
    imageToFrameBuffer((FrameBuffer *)&local_f0,this,(ImageChannelDesc *)local_1f0,&local_208);
    InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector
              ((InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> *)local_1f0);
    local_1f0._0_8_ = (memory_resource *)0x0;
    Imf_2_5::Header::Header
              ((Header *)0x3f800000,0x3f800000,local_138,&local_158,&local_208,local_1f0,0,3);
    p_Var11 = (_Rb_tree_node_base *)Imf_2_5::FrameBuffer::begin();
    for (; p_Var12 = (_Rb_tree_node_base *)Imf_2_5::FrameBuffer::end(), p_Var11 != p_Var12;
        p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
      pcVar13 = (char *)Imf_2_5::Header::channels();
      Imf_2_5::Channel::Channel((Channel *)local_1f0,p_Var11[9]._M_color,1,1,false);
      Imf_2_5::ChannelList::insert(pcVar13,(Channel *)(p_Var11 + 1));
    }
    if ((metadata->renderTimeSeconds).set != false) {
      Imf_2_5::Attribute::Attribute((Attribute *)local_1f0);
      local_1f0._0_8_ = &PTR__Attribute_02d13df0;
      local_1f0._8_4_ = (metadata->renderTimeSeconds).optionalValue;
      Imf_2_5::Header::insert((char *)local_138,(Attribute *)"renderTimeSeconds");
      Imf_2_5::Attribute::~Attribute((Attribute *)local_1f0);
    }
    if ((metadata->cameraFromWorld).set == true) {
      lVar17 = 0;
      do {
        puVar1 = (undefined8 *)((long)&(metadata->cameraFromWorld).optionalValue + lVar17);
        uVar4 = puVar1[1];
        *(undefined8 *)(auStack_98 + lVar17 + -0x20) = *puVar1;
        *(undefined8 *)(auStack_98 + lVar17 + -0x18) = uVar4;
        lVar17 = lVar17 + 0x10;
      } while (lVar17 != 0x40);
      auVar21._8_4_ = local_b8.green.x;
      auVar21._12_4_ = local_b8.green.y;
      auVar21._0_4_ = local_b8.red.x;
      auVar21._4_4_ = local_b8.red.y;
      auVar21._16_4_ = local_b8.blue.x;
      auVar21._20_4_ = local_b8.blue.y;
      auVar21._24_4_ = local_b8.white.x;
      auVar21._28_4_ = local_b8.white.y;
      auVar21._32_32_ = auStack_98;
      auVar21 = vmovdqu64_avx512f(auVar21);
      local_78.x = (float  [4] [4])vmovdqu64_avx512f(auVar21);
      Imf_2_5::TypedAttribute<Imath_2_5::Matrix44<float>_>::TypedAttribute
                ((TypedAttribute<Imath_2_5::Matrix44<float>_> *)local_1f0,&local_78);
      Imf_2_5::Header::insert((char *)local_138,(Attribute *)"worldToCamera");
      Imf_2_5::Attribute::~Attribute((Attribute *)local_1f0);
    }
    if ((metadata->NDCFromWorld).set == true) {
      lVar17 = 0;
      do {
        puVar1 = (undefined8 *)((long)&(metadata->NDCFromWorld).optionalValue + lVar17);
        uVar4 = puVar1[1];
        *(undefined8 *)(auStack_98 + lVar17 + -0x20) = *puVar1;
        *(undefined8 *)(auStack_98 + lVar17 + -0x18) = uVar4;
        lVar17 = lVar17 + 0x10;
      } while (lVar17 != 0x40);
      auVar7._8_4_ = local_b8.green.x;
      auVar7._12_4_ = local_b8.green.y;
      auVar7._0_4_ = local_b8.red.x;
      auVar7._4_4_ = local_b8.red.y;
      auVar7._16_4_ = local_b8.blue.x;
      auVar7._20_4_ = local_b8.blue.y;
      auVar7._24_4_ = local_b8.white.x;
      auVar7._28_4_ = local_b8.white.y;
      auVar7._32_32_ = auStack_98;
      auVar21 = vmovdqu64_avx512f(auVar7);
      local_78.x = (float  [4] [4])vmovdqu64_avx512f(auVar21);
      Imf_2_5::TypedAttribute<Imath_2_5::Matrix44<float>_>::TypedAttribute
                ((TypedAttribute<Imath_2_5::Matrix44<float>_> *)local_1f0,&local_78);
      Imf_2_5::Header::insert((char *)local_138,(Attribute *)"worldToNDC");
      Imf_2_5::Attribute::~Attribute((Attribute *)local_1f0);
    }
    local_140 = this;
    if ((metadata->samplesPerPixel).set == true) {
      Imf_2_5::Attribute::Attribute((Attribute *)local_1f0);
      local_1f0._0_8_ = &PTR__Attribute_02d13e80;
      local_1f0._8_4_ = (metadata->samplesPerPixel).optionalValue;
      Imf_2_5::Header::insert((char *)local_138,(Attribute *)"samplesPerPixel");
      Imf_2_5::Attribute::~Attribute((Attribute *)local_1f0);
    }
    if ((metadata->MSE).set == true) {
      Imf_2_5::Attribute::Attribute((Attribute *)local_1f0);
      local_1f0._0_8_ = &PTR__Attribute_02d13df0;
      local_1f0._8_4_ = (metadata->MSE).optionalValue;
      Imf_2_5::Header::insert((char *)local_138,(Attribute *)"MSE");
      Imf_2_5::Attribute::~Attribute((Attribute *)local_1f0);
    }
    p_Var14 = (metadata->stringVectors)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var18 = &(metadata->stringVectors)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var14 != p_Var18) {
      do {
        Imf_2_5::
        TypedAttribute<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::TypedAttribute((TypedAttribute<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_1f0,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)(p_Var14 + 2));
        Imf_2_5::Header::insert(local_138,(Attribute *)(p_Var14 + 1));
        local_1f0._0_8_ = &PTR__TypedAttribute_02d13d10;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_1f0 + 8));
        Imf_2_5::Attribute::~Attribute((Attribute *)local_1f0);
        p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14);
      } while ((_Rb_tree_header *)p_Var14 != p_Var18);
    }
    aVar15 = (metadata->colorSpace).optionalValue;
    if (aVar15 == (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
                   )0x0) {
      aVar15 = RGBColorSpace::sRGB;
    }
    if ((metadata->colorSpace).set == false) {
      aVar15 = RGBColorSpace::sRGB;
    }
    bVar9 = RGBColorSpace::operator!=((RGBColorSpace *)aVar15,(RGBColorSpace *)RGBColorSpace::sRGB);
    psVar8 = local_1f8;
    if (bVar9) {
      aVar15 = *(aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
                 *)(metadata->colorSpace).optionalValue.__data;
      if (aVar15 == (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
                     )0x0) {
        aVar15 = RGBColorSpace::sRGB;
      }
      if ((metadata->colorSpace).set == false) {
        aVar15 = RGBColorSpace::sRGB;
      }
      local_1f0._0_8_ = *(undefined8 *)aVar15;
      local_78.x[0]._0_8_ = ((Point2f *)((long)aVar15 + 8))->super_Tuple2<pbrt::Point2,_float>;
      local_f8 = ((Point2f *)((long)aVar15 + 0x10))->super_Tuple2<pbrt::Point2,_float>;
      local_100 = ((Point2f *)((long)aVar15 + 0x18))->super_Tuple2<pbrt::Point2,_float>;
      Imf_2_5::Chromaticities::Chromaticities
                (&local_b8,(Vec2 *)local_1f0,(Vec2 *)&local_78,(Vec2 *)&local_f8,(Vec2 *)&local_100)
      ;
      Imf_2_5::Attribute::Attribute((Attribute *)local_1f0);
      local_1f0._0_8_ = &PTR__Attribute_02d13ec8;
      local_1f0._8_4_ = local_b8.red.x;
      local_1f0._12_4_ = local_b8.red.y;
      aStack_1e0.fixed[0] = (int)local_b8.green.x;
      aStack_1e0.fixed[1] = (int)local_b8.green.y;
      aStack_1e0.fixed[2] = (int)local_b8.blue.x;
      aStack_1e0.fixed[3] = (int)local_b8.blue.y;
      VStack_1d0 = local_b8.white;
      Imf_2_5::Header::insert((char *)local_138,(Attribute *)"chromaticities");
      Imf_2_5::Attribute::~Attribute((Attribute *)local_1f0);
    }
    pcVar13 = (psVar8->_M_dataplus)._M_p;
    iVar10 = Imf_2_5::globalThreadCount();
    Imf_2_5::OutputFile::OutputFile((OutputFile *)local_1f0,pcVar13,(Header *)local_138,iVar10);
    Imf_2_5::OutputFile::setFrameBuffer((FrameBuffer *)local_1f0);
    Imf_2_5::OutputFile::writePixels((int)local_1f0);
    Imf_2_5::OutputFile::~OutputFile((OutputFile *)local_1f0);
    Imf_2_5::Header::~Header((Header *)local_138);
    std::
    _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
    ::~_Rb_tree(&local_f0);
    bVar9 = true;
  }
  else {
    if (this->format != U256) {
      LogFatal<char_const(&)[35]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp"
                 ,0x444,"Check failed: %s",(char (*) [35])"Is16Bit(format) || Is32Bit(format)");
    }
    local_c0.
    super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
    .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
             )0;
    ConvertToFormat((Image *)local_1f0,this,Half,&local_c0);
    bVar9 = WriteEXR((Image *)local_1f0,name,metadata);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_178);
    pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::~vector(&local_198);
    pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector
              (&local_1b8);
    pstd::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&aStack_1e0);
  }
  return bVar9;
}

Assistant:

bool Image::WriteEXR(const std::string &name, const ImageMetadata &metadata) const {
    if (Is8Bit(format))
        return ConvertToFormat(PixelFormat::Half).WriteEXR(name, metadata);
    CHECK(Is16Bit(format) || Is32Bit(format));

    try {
        Imath::Box2i displayWindow, dataWindow;
        if (metadata.fullResolution)
            // Agan, -1 offsets to handle inclusive indexing in OpenEXR...
            displayWindow = {Imath::V2i(0, 0),
                             Imath::V2i(metadata.fullResolution->x - 1,
                                        metadata.fullResolution->y - 1)};
        else
            displayWindow = {Imath::V2i(0, 0),
                             Imath::V2i(resolution.x - 1, resolution.y - 1)};

        if (metadata.pixelBounds)
            dataWindow = {
                Imath::V2i(metadata.pixelBounds->pMin.x, metadata.pixelBounds->pMin.y),
                Imath::V2i(metadata.pixelBounds->pMax.x - 1,
                           metadata.pixelBounds->pMax.y - 1)};
        else
            dataWindow = {Imath::V2i(0, 0),
                          Imath::V2i(resolution.x - 1, resolution.y - 1)};

        Imf::FrameBuffer fb = imageToFrameBuffer(*this, AllChannelsDesc(), dataWindow);

        Imf::Header header(displayWindow, dataWindow);
        for (auto iter = fb.begin(); iter != fb.end(); ++iter)
            header.channels().insert(iter.name(), iter.slice().type);

        if (metadata.renderTimeSeconds)
            header.insert("renderTimeSeconds",
                          Imf::FloatAttribute(*metadata.renderTimeSeconds));
        if (metadata.cameraFromWorld) {
            float m[4][4];
            for (int i = 0; i < 4; ++i)
                for (int j = 0; j < 4; ++j)
                    m[i][j] = (*metadata.cameraFromWorld)[i][j];
            header.insert("worldToCamera", Imf::M44fAttribute(m));
        }
        if (metadata.NDCFromWorld) {
            float m[4][4];
            for (int i = 0; i < 4; ++i)
                for (int j = 0; j < 4; ++j)
                    m[i][j] = (*metadata.NDCFromWorld)[i][j];
            header.insert("worldToNDC", Imf::M44fAttribute(m));
        }
        if (metadata.samplesPerPixel)
            header.insert("samplesPerPixel",
                          Imf::IntAttribute(*metadata.samplesPerPixel));
        if (metadata.MSE)
            header.insert("MSE", Imf::FloatAttribute(*metadata.MSE));
        for (const auto &iter : metadata.stringVectors)
            header.insert(iter.first, Imf::StringVectorAttribute(iter.second));

        // The OpenEXR spec says that the default is sRGB if no
        // chromaticities are provided.  It should be innocuous to write
        // the sRGB primaries anyway, but for completely indecipherable
        // reasons, OSX's Preview.app decides to gamma correct the pixels
        // in EXR files if it finds primaries.  So, we don't write them in
        // that case in the interests of nicer looking images on the
        // screen.
        if (*metadata.GetColorSpace() != *RGBColorSpace::sRGB) {
            const RGBColorSpace &cs = *metadata.GetColorSpace();
            Imf::Chromaticities chromaticities(
                Imath::V2f(cs.r.x, cs.r.y), Imath::V2f(cs.g.x, cs.g.y),
                Imath::V2f(cs.b.x, cs.b.y), Imath::V2f(cs.w.x, cs.w.y));
            header.insert("chromaticities", Imf::ChromaticitiesAttribute(chromaticities));
        }

        Imf::OutputFile file(name.c_str(), header);
        file.setFrameBuffer(fb);
        file.writePixels(resolution.y);
    } catch (const std::exception &exc) {
        Error("%s: error writing EXR: %s", name.c_str(), exc.what());
        return false;
    }

    return true;
}